

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::parseIdentifier(Parser *this,Identifier *dest)

{
  TokenType TVar1;
  Token *this_00;
  
  this_00 = nextToken(this);
  TVar1 = this_00->type;
  if (TVar1 == Identifier) {
    Token::identifierValue(this_00);
    std::__cxx11::string::_M_assign((string *)dest);
  }
  return TVar1 == Identifier;
}

Assistant:

bool Parser::parseIdentifier(Identifier& dest)
{
	const Token& tok = nextToken();
	if (tok.type != TokenType::Identifier)
		return false;

	dest = tok.identifierValue();
	return true;
}